

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void Hash_init(HashInfo *info)

{
  pfHash p_Var1;
  void *__src;
  long lVar2;
  
  p_Var1 = info->hash;
  if (p_Var1 == sha2_224_64) {
    sha224_init(&ltc_state);
    return;
  }
  if (p_Var1 == rmd128) {
    rmd128_init(&ltc_state);
    return;
  }
  if (p_Var1 == clhash_test) {
    __src = get_random_key_for_clhash(0xb3816f6a2c68e530,0x2c7);
    memcpy(clhash_random,__src,0x428);
    return;
  }
  if (p_Var1 != VHASH_32 && p_Var1 != VHASH_64) {
    if (p_Var1 == tsip_test) {
      tsip_key._0_8_ = random();
      lVar2 = random();
      tsip_key[8] = (char)lVar2;
      tsip_key[9] = (char)((ulong)lVar2 >> 8);
      tsip_key[10] = (char)((ulong)lVar2 >> 0x10);
      tsip_key[0xb] = (char)((ulong)lVar2 >> 0x18);
      tsip_key[0xc] = (char)((ulong)lVar2 >> 0x20);
      tsip_key[0xd] = (char)((ulong)lVar2 >> 0x28);
      tsip_key[0xe] = (char)((ulong)lVar2 >> 0x30);
      tsip_key[0xf] = (char)((ulong)lVar2 >> 0x38);
      return;
    }
    if (p_Var1 != chaskey_test) {
      return;
    }
    subkeys(k1,k2,k);
    return;
  }
  vmac_set_key((uchar *)"abcdefghijklmnop",&vhi.ctx);
  return;
}

Assistant:

void Hash_init (HashInfo* info) {
  if (info->hash == sha2_224_64)
    sha224_init(&ltc_state);
  else if (info->hash == rmd128)
    rmd128_init(&ltc_state);
#if defined(__SSE4_2__) && defined(__x86_64__)
  else if(info->hash == clhash_test)
    clhash_init();
#endif
  else if (info->hash == VHASH_32 || info->hash == VHASH_64)
    VHASH_init();
#ifdef HAVE_HIGHWAYHASH
  else if(info->hash == HighwayHash64_test)
    HighwayHash_init();
#endif
#ifndef _MSC_VER
  else if(info->hash == tsip_test)
    tsip_init();
#endif
  else if(info->hash == chaskey_test)
    chaskey_init();
}